

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radiobox.cpp
# Opt level: O3

Element __thiscall ftxui::anon_unknown_3::RadioboxBase::Render(RadioboxBase *this)

{
  ComponentBase *pCVar1;
  RadioboxBase *pRVar2;
  bool bVar3;
  ComponentBase *pCVar4;
  pointer psVar5;
  ComponentBase *pCVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ComponentBase *in_RSI;
  ulong uVar7;
  ComponentBase *pCVar8;
  int iVar9;
  size_t i;
  code *pcVar10;
  Element EVar11;
  Elements elements;
  Decorator style;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_1b8;
  code *local_198;
  ComponentBase **local_190;
  long local_188;
  _Any_data local_180;
  code *local_170;
  code *local_168;
  string local_160;
  RadioboxBase *local_140;
  ComponentBase *local_138;
  ComponentBase *local_130;
  Element local_128;
  shared_ptr<ftxui::Node> local_118;
  Element local_108;
  string local_f8;
  ftxui local_d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  ftxui local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  ftxui local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Any_data local_a8;
  code *local_98;
  _Any_data local_88;
  code *local_78;
  _Any_data local_68;
  code *local_58;
  Elements local_48;
  
  local_1b8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = ComponentBase::Focused(in_RSI);
  local_190 = &in_RSI[1].parent_;
  psVar5 = (pointer)in_RSI[1]._vptr_ComponentBase;
  if (psVar5 == (pointer)0x0) {
    psVar5 = in_RSI[1].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::resize
            ((vector<ftxui::Box,_std::allocator<ftxui::Box>_> *)local_190,
             (long)(psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi -
             (long)(psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr >> 5);
  psVar5 = (pointer)in_RSI[1]._vptr_ComponentBase;
  if (psVar5 == (pointer)0x0) {
    psVar5 = in_RSI[1].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  local_140 = this;
  if ((element_type *)
      (psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi != (psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
     ) {
    if (bVar3) {
      local_198 = focus;
    }
    else {
      local_198 = select;
    }
    local_138 = in_RSI + 1;
    local_130 = (ComponentBase *)
                &in_RSI[2].children_.
                 super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    local_188 = 0;
    i = 0;
    do {
      pCVar1 = local_130;
      pCVar4 = in_RSI[6].parent_;
      if (in_RSI[6].parent_ == (ComponentBase *)0x0) {
        pCVar4 = local_130;
      }
      pCVar8 = (ComponentBase *)
               pCVar4[4].children_.
               super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar6 = pCVar4 + 4;
      if (pCVar8 != (ComponentBase *)0x0) {
        pCVar6 = pCVar8;
      }
      iVar9 = (int)i;
      uVar7 = (ulong)(iVar9 != *(int *)&pCVar6->_vptr_ComponentBase) << 5 | 0x40;
      if (!bVar3) {
        uVar7 = 0x60;
      }
      std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
                ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_a8,
                 (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
                 ((long)&pCVar4->_vptr_ComponentBase + uVar7));
      pCVar4 = in_RSI[6].parent_;
      if (in_RSI[6].parent_ == (ComponentBase *)0x0) {
        pCVar4 = pCVar1;
      }
      pCVar1 = (ComponentBase *)
               pCVar4[4].children_.
               super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar8 = pCVar4 + 4;
      if (pCVar1 != (ComponentBase *)0x0) {
        pCVar8 = pCVar1;
      }
      pcVar10 = local_198;
      if (iVar9 != *(int *)&pCVar8->_vptr_ComponentBase) {
        pcVar10 = nothing;
      }
      uVar7 = (ulong)(iVar9 != *(int *)&((in_RSI[1].children_.
                                          super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                        super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,(pointer)(&pCVar4->_vptr_ComponentBase)[uVar7 * 4],
                 (long)&(((pointer)(&pCVar4->_vptr_ComponentBase)[uVar7 * 4])->
                        super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 + (long)*(pointer *)((long)&pCVar4->children_ + uVar7 * 0x20));
      text((ftxui *)&local_118,&local_160);
      ConstStringListRef::operator[][abi_cxx11_(&local_f8,(ConstStringListRef *)local_138,i);
      text((ftxui *)&local_128,&local_f8);
      std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
                ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_68,
                 (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_a8)
      ;
      operator|(local_d8,&local_128,(Decorator *)&local_68);
      hbox<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
                (local_c8,&local_118,(shared_ptr<ftxui::Node> *)local_d8);
      local_180._8_8_ = 0;
      local_168 = std::
                  _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                  ::_M_invoke;
      local_170 = std::
                  _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                  ::_M_manager;
      local_180._M_unused._M_object = pcVar10;
      operator|((ftxui *)&local_108,(Element *)local_c8,(Decorator *)&local_180);
      reflect((Box *)((long)&(*local_190)->_vptr_ComponentBase + local_188));
      operator|(local_b8,&local_108,(Decorator *)&local_88);
      std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>::
      emplace_back<std::shared_ptr<ftxui::Node>>
                ((vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>
                  *)&local_1b8,(shared_ptr<ftxui::Node> *)local_b8);
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      if (local_108.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_170 != (code *)0x0) {
        (*local_170)(&local_180,&local_180,__destroy_functor);
      }
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
      }
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
      }
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      if (local_128.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
      psVar5 = (pointer)in_RSI[1]._vptr_ComponentBase;
      if (psVar5 == (pointer)0x0) {
        psVar5 = in_RSI[1].children_.
                 super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      i = i + 1;
      local_188 = local_188 + 0x10;
    } while (i < (ulong)((long)(psVar5->
                               super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_refcount._M_pi -
                         (long)(psVar5->
                               super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr >> 5));
  }
  pRVar2 = local_140;
  local_48.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_1b8.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_1b8.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1b8.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vbox((ftxui *)local_140,&local_48);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_48);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_1b8);
  EVar11.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar11.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pRVar2
  ;
  return (Element)EVar11.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    Elements elements;
    bool is_focused = Focused();
    boxes_.resize(entries_.size());
    for (size_t i = 0; i < entries_.size(); ++i) {
      auto style = (focused_entry() == int(i) && is_focused)
                       ? option_->style_focused
                       : option_->style_unfocused;
      auto focus_management = (focused_entry() != int(i)) ? nothing
                              : is_focused                ? focus
                                                          : select;

      const std::string& symbol = *selected_ == int(i)
                                      ? option_->style_checked
                                      : option_->style_unchecked;
      elements.push_back(hbox(text(symbol), text(entries_[i]) | style) |
                         focus_management | reflect(boxes_[i]));
    }
    return vbox(std::move(elements));
  }